

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_paramhlp.c
# Opt level: O3

ParameterError proto2num(OperationConfig *config,char **val,char **ostr,char *str)

{
  char **ppcVar1;
  long *plVar2;
  bool bVar3;
  bool bVar4;
  long lVar5;
  int iVar6;
  CURLcode CVar7;
  long *__dest;
  char *pcVar8;
  size_t sVar9;
  long *plVar10;
  size_t sVar11;
  long *plVar12;
  ParameterError PVar13;
  int iVar14;
  long lVar15;
  char *pcVar16;
  char cVar17;
  char *pcVar18;
  dynbuf obuf;
  char buffer [32];
  dynbuf local_78;
  char local_58 [40];
  
  curlx_dyn_init(&local_78,0x2c0);
  __dest = (long *)malloc(proto_count * 8 + 8);
  if (__dest == (long *)0x0) {
    PVar13 = PARAM_NO_MEM;
  }
  else {
    *__dest = 0;
    pcVar8 = *val;
    while (pcVar8 != (char *)0x0) {
      pcVar8 = proto_token(pcVar8);
      plVar10 = __dest;
      if (pcVar8 != (char *)0x0) {
        do {
          plVar12 = plVar10;
          if ((char *)*plVar12 == (char *)0x0) break;
          plVar10 = plVar12 + 1;
        } while ((char *)*plVar12 != pcVar8);
        if (*plVar12 == 0) {
          *plVar12 = (long)pcVar8;
          plVar12[1] = 0;
        }
      }
      ppcVar1 = val + 1;
      val = val + 1;
      pcVar8 = *ppcVar1;
    }
    cVar17 = *str;
    if (cVar17 != '\0') {
      do {
        pcVar8 = strchr(str,0x2c);
        if (pcVar8 == (char *)0x0) {
          sVar9 = strlen(str);
          pcVar18 = (char *)(sVar9 - 1);
LAB_0011ac04:
          pcVar16 = str + 1;
          iVar14 = 0;
          if (cVar17 == '+') {
            bVar4 = false;
LAB_0011ac37:
            bVar3 = false;
          }
          else {
            if (cVar17 == '=') {
              iVar14 = 2;
              bVar4 = true;
              goto LAB_0011ac37;
            }
            if (cVar17 == '-') {
              iVar14 = 1;
              bVar3 = true;
              bVar4 = false;
            }
            else {
              pcVar18 = pcVar18 + 1;
              bVar4 = false;
              bVar3 = false;
              iVar14 = 0;
              pcVar16 = str;
            }
          }
          if ((pcVar18 == (char *)0x3) && (iVar6 = curl_strnequal(pcVar16,"all",3), iVar6 != 0)) {
            if (bVar3) {
              *__dest = 0;
            }
            else {
              memcpy(__dest,built_in_protos,proto_count * 8 + 8);
            }
          }
          else {
            curl_msnprintf(local_58,0x20,"%.*s",(ulong)pcVar18 & 0xffffffff,pcVar16);
            pcVar18 = proto_token(local_58);
            if (pcVar18 == (char *)0x0) {
              if (bVar4) {
                *__dest = 0;
              }
              warnf(config->global,"unrecognized protocol \'%s\'",local_58);
            }
            else {
              plVar10 = __dest;
              if (iVar14 != 0) {
                plVar12 = __dest + -1;
                if (iVar14 != 2) {
                  do {
                    plVar10 = plVar12 + 1;
                    plVar12 = plVar12 + 1;
                    if ((char *)*plVar10 == (char *)0x0) break;
                  } while ((char *)*plVar10 != pcVar18);
                  plVar10 = __dest + -2;
                  if (*plVar12 != 0) {
                    do {
                      plVar2 = plVar10 + 2;
                      plVar10 = plVar10 + 1;
                    } while (*plVar2 != 0);
                    *plVar12 = *plVar10;
                    *plVar10 = 0;
                  }
                  goto LAB_0011ad8f;
                }
                *__dest = 0;
              }
              do {
                plVar12 = plVar10;
                if ((char *)*plVar12 == (char *)0x0) break;
                plVar10 = plVar12 + 1;
              } while ((char *)*plVar12 != pcVar18);
              if (*plVar12 == 0) {
                *plVar12 = (long)pcVar18;
                plVar12[1] = 0;
              }
            }
          }
LAB_0011ad8f:
          str = pcVar8;
          if (pcVar8 == (char *)0x0) break;
        }
        else if (str != pcVar8) {
          pcVar18 = pcVar8 + ~(ulong)str;
          goto LAB_0011ac04;
        }
        cVar17 = str[1];
        str = str + 1;
      } while (cVar17 != '\0');
    }
    lVar15 = -8;
    do {
      lVar5 = lVar15 + 8;
      lVar15 = lVar15 + 8;
    } while (*(long *)((long)__dest + lVar5) != 0);
    qsort(__dest,lVar15 >> 3,8,struplocompare4sort);
    CVar7 = curlx_dyn_addn(&local_78,"",0);
    if ((*__dest != 0) && (CVar7 == CURLE_OK)) {
      plVar10 = __dest;
      do {
        plVar10 = plVar10 + 1;
        CVar7 = curlx_dyn_addf(&local_78,"%s,");
        if (*plVar10 == 0) break;
      } while (CVar7 == CURLE_OK);
    }
    free(__dest);
    sVar11 = curlx_dyn_len(&local_78);
    curlx_dyn_setlen(&local_78,sVar11 - 1);
    free(*ostr);
    pcVar8 = curlx_dyn_ptr(&local_78);
    *ostr = pcVar8;
    PVar13 = PARAM_OK;
    if (pcVar8 == (char *)0x0) {
      PVar13 = PARAM_NO_MEM;
    }
  }
  return PVar13;
}

Assistant:

ParameterError proto2num(struct OperationConfig *config,
                         const char * const *val, char **ostr, const char *str)
{
  const char **protoset;
  struct curlx_dynbuf obuf;
  size_t proto;
  CURLcode result;

  curlx_dyn_init(&obuf, MAX_PROTOSTRING);

  protoset = malloc((proto_count + 1) * sizeof(*protoset));
  if(!protoset)
    return PARAM_NO_MEM;

  /* Preset protocol set with default values. */
  protoset[0] = NULL;
  for(; *val; val++) {
    const char *p = proto_token(*val);

    if(p)
      protoset_set(protoset, p);
  }

  while(*str) {
    const char *next = strchr(str, ',');
    size_t plen;
    enum e_action { allow, deny, set } action = allow;

    if(next) {
      if(str == next) {
        str++;
        continue;
      }
      plen = next - str - 1;
    }
    else
      plen = strlen(str) - 1;

    /* Process token modifiers */
    switch(*str++) {
    case '=':
      action = set;
      break;
    case '-':
      action = deny;
      break;
    case '+':
      action = allow;
      break;
    default:
      /* no modifier */
      str--;
      plen++;
      break;
    }

    if((plen == 3) && curl_strnequal(str, "all", 3)) {
      switch(action) {
      case deny:
        protoset[0] = NULL;
        break;
      case allow:
      case set:
        memcpy((char *) protoset,
               built_in_protos, (proto_count + 1) * sizeof(*protoset));
        break;
      }
    }
    else {
      char buffer[32];
      const char *p;
      msnprintf(buffer, sizeof(buffer), "%.*s", (int)plen, str);

      p = proto_token(buffer);

      if(p)
        switch(action) {
        case deny:
          protoset_clear(protoset, p);
          break;
        case set:
          protoset[0] = NULL;
          FALLTHROUGH();
        case allow:
          protoset_set(protoset, p);
          break;
        }
      else { /* unknown protocol */
        /* If they have specified only this protocol, we say treat it as
           if no protocols are allowed */
        if(action == set)
          protoset[0] = NULL;
        warnf(config->global, "unrecognized protocol '%s'", buffer);
      }
    }
    if(next)
      str = next + 1;
    else
      break;
  }

  /* We need the protocols in alphabetic order for CI tests requirements. */
  qsort((char *) protoset, protoset_index(protoset, NULL), sizeof(*protoset),
        struplocompare4sort);

  result = curlx_dyn_addn(&obuf, "", 0);
  for(proto = 0; protoset[proto] && !result; proto++)
    result = curlx_dyn_addf(&obuf, "%s,", protoset[proto]);
  free((char *) protoset);
  curlx_dyn_setlen(&obuf, curlx_dyn_len(&obuf) - 1);
  free(*ostr);
  *ostr = curlx_dyn_ptr(&obuf);

  return *ostr ? PARAM_OK : PARAM_NO_MEM;
}